

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

void cppcms::xss::anon_unknown_8::split_to_parts
               (char *begin,char *end,
               vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
               *tags)

{
  char *pcVar1;
  entry *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char c_2;
  char *e_3;
  char *e_2;
  char c_1;
  char *tmp_1;
  html_data_type type;
  char *e_1;
  char *e;
  char c;
  char *p;
  char *tmp;
  uint count;
  undefined4 in_stack_fffffffffffffca8;
  html_data_type in_stack_fffffffffffffcac;
  entry *in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcb8;
  entry *in_stack_fffffffffffffcc0;
  size_type in_stack_fffffffffffffcd8;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  *in_stack_fffffffffffffce0;
  char local_2c8 [79];
  char local_279;
  char *local_278;
  char *local_198;
  char local_f9;
  char *local_f8;
  undefined4 local_ec;
  char *local_e8;
  char *local_40;
  char local_31;
  char *local_30;
  char *local_28;
  int local_1c;
  entry *local_18;
  char *local_10;
  char *local_8;
  
  local_1c = 0;
  for (local_28 = in_RDI; local_28 != in_RSI; local_28 = local_28 + 1) {
    if (*local_28 == '<') {
      local_1c = local_1c + 1;
    }
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ::clear((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           *)0x45b812);
  std::
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ::reserve(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  local_30 = local_8;
LAB_0045b838:
  do {
    while( true ) {
      if (local_30 == local_10) {
        return;
      }
      local_31 = *local_30;
      pcVar1 = local_30;
      if (local_31 != '&') break;
      do {
        local_40 = pcVar1 + 1;
        if (local_40 == local_10) break;
        pcVar1 = local_40;
      } while (*local_40 != ';');
      if (local_40 == local_10) {
        entry::entry(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                     (char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                     *)in_stack_fffffffffffffcb0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        entry::~entry((entry *)0x45b963);
        local_30 = local_10;
      }
      else {
        entry::entry(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                     (char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                     *)in_stack_fffffffffffffcb0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        entry::~entry((entry *)0x45b9f3);
        local_30 = local_40 + 1;
      }
    }
    if (local_31 != '<') {
      if (local_31 == '>') {
        in_stack_fffffffffffffcc0 = local_18;
        entry::entry(local_18,in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                     in_stack_fffffffffffffcac);
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                     *)in_stack_fffffffffffffcb0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        entry::~entry((entry *)0x45beb4);
        local_30 = local_30 + 1;
      }
      else {
        while ((local_278 = pcVar1 + 1, local_278 != local_10 &&
               (local_279 = *local_278, local_279 != '<'))) {
          if ((local_279 == '>') || (pcVar1 = local_278, local_279 == '&')) break;
        }
        in_stack_fffffffffffffcb8 = local_2c8;
        in_stack_fffffffffffffcb0 = local_18;
        entry::entry(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,(char *)local_18,
                     in_stack_fffffffffffffcac);
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                     *)in_stack_fffffffffffffcb0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        entry::~entry((entry *)0x45bfc9);
        local_30 = local_278;
      }
      goto LAB_0045b838;
    }
    if ((((local_30 + 4 < local_10) && (local_30[1] == '!')) && (local_30[2] == '-')) &&
       (local_30[3] == '-')) {
      for (local_e8 = local_30 + 4;
          (local_e8 < local_10 + -1 && ((*local_e8 != '-' || (local_e8[1] != '-'))));
          local_e8 = local_e8 + 1) {
      }
      if ((local_e8 + 2 < local_10) && (local_e8[2] == '>')) {
        local_ec = 7;
        for (local_f8 = local_30 + 4; local_f8 < local_e8; local_f8 = local_f8 + 1) {
          local_f9 = *local_f8;
          if (((local_f9 == '>') || (local_f9 == '<')) || (local_f9 == '&')) {
            local_ec = 0;
            break;
          }
        }
        entry::entry(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                     (char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                     *)in_stack_fffffffffffffcb0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        entry::~entry((entry *)0x45bc08);
        local_30 = local_e8 + 3;
      }
      else {
        entry::entry(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                     (char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                     *)in_stack_fffffffffffffcb0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        entry::~entry((entry *)0x45bc96);
        local_30 = local_10;
      }
    }
    else {
      do {
        local_198 = pcVar1 + 1;
        if (local_198 == local_10) break;
        pcVar1 = local_198;
      } while (*local_198 != '>');
      if (local_198 == local_10) {
        entry::entry(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                     (char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                     *)in_stack_fffffffffffffcb0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        entry::~entry((entry *)0x45bd94);
        local_30 = local_10;
      }
      else {
        entry::entry(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                     (char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back((vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                     *)in_stack_fffffffffffffcb0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        entry::~entry((entry *)0x45be24);
        local_30 = local_198 + 1;
      }
    }
  } while( true );
}

Assistant:

void split_to_parts(char const *begin,char const *end,std::vector<entry> &tags)
		{
			unsigned count = 0;

			for(char const *tmp = begin;tmp!=end;tmp++) {
				if(*tmp == '<')
					count++;
			}
			
			tags.clear();
			tags.reserve(count);

			char const *p=begin;

			while(p!=end) {
				char c=*p;
				switch(c) {
				case '&':
					{
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							if(*e==';')
								break;
						}

						if(e==end) {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}
						else {
							tags.push_back(entry(p,e+1,html_entity));
							p=e+1;
						}
					}
					break;

				case '<':

					if(p+4 < end && p[1]=='!' && p[2]=='-' && p[3]=='-') {
						char const *e =p + 4;
						while(e<end-1) {
							if(e[0]=='-' && e[1]=='-') 
								break;
							e++;
						}
						if(e+2<end && e[2]=='>') {
							
							html_data_type type = html_comment;
							
							for(char const *tmp = p+4;tmp<e;tmp++) {
								char c=*tmp;
								///
								/// Prevent IE conditionals
								///
								if(c=='>' || c=='<' || c=='&') {
									type = invalid_data;
									break;
								}
							}

							tags.push_back(entry(p,e+3,type));
							p=e+3;
						}
						else {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}

					}
					else {
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							if(*e=='>')
								break;
						}
						if(e==end) {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}
						else {
							tags.push_back(entry(p,e+1,html_tag));
							p=e+1;
						}
					}

					break;

				case '>':
					{
						tags.push_back(entry(p,p+1,invalid_data));
						p++;
					}
					break;
				default:
					{
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							char c=*e;
							if(c=='<' || c=='>' || c=='&')
								break;
						}
						tags.push_back(entry(p,e,plain_text));
						p=e;
					}
				} 
			} // while 
		}